

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O1

size_t dlbulk_free(void **array,size_t nelem)

{
  mstate m;
  long lVar1;
  byte *pbVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  size_t psize;
  
  if (nelem != 0) {
    lVar1 = nelem * 8;
    lVar7 = nelem << 3;
    lVar8 = 0;
    do {
      lVar3 = *(long *)((long)array + lVar8);
      if (lVar3 != 0) {
        m = (mstate)(lVar3 + -0x10);
        uVar6 = *(ulong *)(lVar3 + -8);
        *(undefined8 *)((long)array + lVar8) = 0;
        if (m < _gm_.least_addr) {
LAB_00105dc9:
          abort();
        }
        uVar4 = (uint)uVar6;
        uVar5 = uVar4 & 3;
        psize = (size_t)uVar5;
        if (uVar5 == 1) goto LAB_00105dc9;
        nelem = uVar6 & 0xfffffffffffffff8;
        if ((lVar1 + -8 == lVar8) ||
           (psize = (long)&((mchunkptr)nelem)->prev_foot + (long)(m->smallbins + -7),
           *(size_t *)((long)array + lVar8 + 8) != psize)) {
          dispose_chunk(m,(mchunkptr)nelem,psize);
        }
        else {
          uVar6 = *(ulong *)(lVar3 + -8 + nelem) & 0xfffffffffffffff8;
          *(ulong *)(lVar3 + -8) = (long)&((mchunkptr)nelem)->prev_foot + (uVar4 & 1) + uVar6 + 2;
          pbVar2 = (byte *)(nelem + lVar3 + -8 + uVar6);
          *pbVar2 = *pbVar2 | 1;
          *(long *)((long)array + lVar8 + 8) = lVar3;
        }
      }
      lVar8 = lVar8 + 8;
    } while (lVar7 != lVar8);
  }
  if (_gm_.trim_check < _gm_.topsize) {
    sys_trim((mstate)0x0,nelem);
  }
  return 0;
}

Assistant:

static size_t internal_bulk_free(mstate m, void* array[], size_t nelem) {
  size_t unfreed = 0;
  if (!PREACTION(m)) {
    void** a;
    void** fence = &(array[nelem]);
    for (a = array; a != fence; ++a) {
      void* mem = *a;
      if (mem != 0) {
        mchunkptr p = mem2chunk(mem);
        size_t psize = chunksize(p);
#if FOOTERS
        if (get_mstate_for(p) != m) {
          ++unfreed;
          continue;
        }
#endif
        check_inuse_chunk(m, p);
        *a = 0;
        if (RTCHECK(ok_address(m, p) && ok_inuse(p))) {
          void ** b = a + 1; /* try to merge with next chunk */
          mchunkptr next = next_chunk(p);
          if (b != fence && *b == chunk2mem(next)) {
            size_t newsize = chunksize(next) + psize;
            set_inuse(m, p, newsize);
            *b = chunk2mem(p);
          }
          else
            dispose_chunk(m, p, psize);
        }
        else {
          CORRUPTION_ERROR_ACTION(m);
          break;
        }
      }
    }
    if (should_trim(m, m->topsize))
      sys_trim(m, 0);
    POSTACTION(m);
  }
  return unfreed;
}